

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry>::removeLast
          (ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry> *this)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  
  lVar1 = *(long *)(this + 8);
  *(undefined8 **)(this + 8) = (undefined8 *)(lVar1 + -0x20);
  lVar2 = *(long *)(lVar1 + -0x20);
  if (lVar2 != 0) {
    uVar3 = *(undefined8 *)(lVar1 + -0x18);
    *(undefined8 *)(lVar1 + -0x20) = 0;
    *(undefined8 *)(lVar1 + -0x18) = 0;
    (**(code **)**(undefined8 **)(lVar1 + -0x10))
              (*(undefined8 **)(lVar1 + -0x10),lVar2,1,uVar3,uVar3,0);
  }
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }